

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O2

void __thiscall
duckdb::WindowBoundariesState::FrameEnd
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,
          WindowInputExpression *boundary_end,ValidityMask *order_mask,
          optional_ptr<duckdb::WindowCursor,_true> range)

{
  long lVar1;
  undefined1 *order_begin;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *puVar2;
  idx_t iVar3;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> order_end;
  WindowInputExpression *this_00;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  long lVar7;
  unsigned_long uVar8;
  idx_t iVar9;
  idx_t iVar10;
  WindowCursor *pWVar11;
  type pWVar12;
  OutOfRangeException *pOVar13;
  InternalException *this_01;
  idx_t *piVar14;
  idx_t *piVar15;
  idx_t *values;
  idx_t chunk_idx;
  undefined1 *puVar16;
  allocator local_b9;
  idx_t *local_b8;
  idx_t local_b0;
  FrameBounds *local_a8;
  idx_t *local_a0;
  idx_t *local_98;
  WindowInputExpression *local_90;
  optional_ptr<duckdb::WindowCursor,_true> *local_88;
  idx_t local_80;
  idx_t *local_78;
  unsigned_long n;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *local_50;
  idx_t *local_48;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *local_40;
  optional_ptr<duckdb::WindowCursor,_true> *local_38;
  
  local_b0 = row_idx;
  local_a8 = (FrameBounds *)order_mask;
  local_90 = boundary_end;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,0);
  local_a0 = (idx_t *)pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,1);
  local_78 = (idx_t *)pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,3);
  piVar15 = (idx_t *)pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,4);
  piVar14 = (idx_t *)pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,5);
  puVar2 = (unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
           pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,7);
  local_b8 = (idx_t *)pvVar5->data;
  local_80 = *local_a0;
  (this->prev).start = *piVar14;
  (this->prev).end =
       (idx_t)(puVar2->
              super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>).
              _M_t.
              super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
              .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
  local_98 = piVar15;
  local_50 = puVar2;
  local_48 = piVar14;
  if (((this->has_preceding_range != false) || (this->has_following_range == true)) &&
     ((this->range_lo).ptr != range.ptr)) {
    (this->range_lo).ptr = range.ptr;
    optional_ptr<duckdb::WindowCursor,_true>::operator->(&this->range_lo);
    WindowCursor::Copy((WindowCursor *)&n);
    uVar8 = n;
    n = 0;
    ::std::__uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::reset
              ((__uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *)
               &this->range_hi,(pointer)uVar8);
    piVar15 = local_98;
    ::std::unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::~unique_ptr
              ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *)&n);
  }
  this_00 = local_90;
  piVar14 = local_a0;
  values = local_b8;
  if (this->end_boundary < (EXPR_FOLLOWING_RANGE|CURRENT_ROW_ROWS)) {
    local_88 = (optional_ptr<duckdb::WindowCursor,_true> *)count;
    switch(this->end_boundary) {
    default:
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&n,"Unsupported window end boundary",&local_b9);
      InternalException::InternalException(this_01,(string *)&n);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case UNBOUNDED_FOLLOWING:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,7);
      pvVar6 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,1);
      Vector::Reference(pvVar5,pvVar6);
      return;
    case CURRENT_ROW_RANGE:
    case CURRENT_ROW_GROUPS:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,7);
      pvVar6 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,3);
      Vector::Reference(pvVar5,pvVar6);
      values = piVar15;
      break;
    case CURRENT_ROW_ROWS:
      local_b0 = local_b0 + 1;
      for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
        local_b8[iVar9] = local_b0 + iVar9;
      }
      break;
    case EXPR_PRECEDING_ROWS:
      local_b0 = local_b0 + 1;
      for (iVar9 = 0; piVar14 = local_a0, values = local_b8, count != iVar9; iVar9 = iVar9 + 1) {
        lVar1 = local_b0 + iVar9;
        lVar7 = WindowInputExpression::GetCell<long>(this_00,iVar9);
        bVar4 = TrySubtractOperator::Operation<long,long,long>(lVar1,lVar7,(int64_t *)&n);
        if (bVar4) {
          iVar10 = n;
          if ((long)n < 1) {
            iVar10 = 0;
          }
        }
        else {
          iVar10 = local_78[iVar9];
        }
        local_b8[iVar9] = iVar10;
      }
      break;
    case EXPR_FOLLOWING_ROWS:
      local_b0 = local_b0 + 1;
      for (iVar9 = 0; piVar14 = local_a0, values = local_b8, count != iVar9; iVar9 = iVar9 + 1) {
        lVar1 = local_b0 + iVar9;
        lVar7 = WindowInputExpression::GetCell<long>(this_00,iVar9);
        bVar4 = TryAddOperator::Operation<long,long,long>(lVar1,lVar7,(int64_t *)&n);
        if (bVar4) {
          iVar10 = n;
          if ((long)n < 1) {
            iVar10 = 0;
          }
        }
        else {
          iVar10 = local_78[iVar9];
        }
        local_b8[iVar9] = iVar10;
      }
      break;
    case EXPR_PRECEDING_RANGE:
      local_88 = &this->range_lo;
      local_50 = &this->range_hi;
      local_a8 = &this->prev;
      for (iVar9 = 0; values = local_b8, count != iVar9; iVar9 = iVar9 + 1) {
        bVar4 = WindowInputExpression::CellIsNull(this_00,iVar9);
        if (bVar4) {
          iVar10 = piVar15[iVar9];
          local_b0 = local_b0 + 1;
        }
        else {
          iVar10 = local_48[iVar9];
          local_a8->start = iVar10;
          iVar3 = piVar14[iVar9];
          if (iVar3 != local_80) {
            (this->prev).end = this->valid_end;
            local_80 = iVar3;
          }
          pWVar11 = optional_ptr<duckdb::WindowCursor,_true>::operator*(local_88);
          pWVar12 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                    ::operator*(local_50);
          local_b0 = local_b0 + 1;
          iVar10 = FindOrderedRangeBound<false>
                             (pWVar11,pWVar12,this->range_sense,iVar10,local_b0,this->end_boundary,
                              this_00,iVar9,local_a8);
          (this->prev).end = iVar10;
          piVar14 = local_a0;
          piVar15 = local_98;
        }
        local_b8[iVar9] = iVar10;
      }
      break;
    case EXPR_FOLLOWING_RANGE:
      local_38 = &this->range_lo;
      local_40 = &this->range_hi;
      local_a8 = &this->prev;
      for (puVar16 = (undefined1 *)0x0; values = local_b8, (undefined1 *)count != puVar16;
          puVar16 = puVar16 + 1) {
        bVar4 = WindowInputExpression::CellIsNull(this_00,(idx_t)puVar16);
        if (bVar4) {
          iVar9 = piVar15[(long)puVar16];
        }
        else {
          order_end._M_head_impl =
               local_50[(long)puVar16].
               super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
               .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
          local_a8->start = local_48[(long)puVar16];
          iVar9 = piVar14[(long)puVar16];
          if (iVar9 != local_80) {
            (this->prev).end = (idx_t)order_end._M_head_impl;
            local_80 = iVar9;
          }
          order_begin = puVar16 + local_b0;
          pWVar11 = optional_ptr<duckdb::WindowCursor,_true>::operator*(local_38);
          pWVar12 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                    ::operator*(local_40);
          iVar9 = FindOrderedRangeBound<false>
                            (pWVar11,pWVar12,this->range_sense,(idx_t)order_begin,
                             (idx_t)order_end._M_head_impl,this->end_boundary,this_00,(idx_t)puVar16
                             ,local_a8);
          (this->prev).end = iVar9;
          piVar14 = local_a0;
          count = (idx_t)local_88;
          piVar15 = local_98;
        }
        local_b8[(long)puVar16] = iVar9;
      }
      break;
    case EXPR_PRECEDING_GROUPS:
      for (puVar16 = (undefined1 *)0x0; count = (idx_t)local_88, values = local_b8,
          local_88 != (optional_ptr<duckdb::WindowCursor,_true> *)puVar16; puVar16 = puVar16 + 1) {
        bVar4 = WindowInputExpression::CellIsNull(this_00,(idx_t)puVar16);
        iVar9 = piVar15[(long)puVar16];
        if (!bVar4) {
          iVar10 = piVar14[(long)puVar16];
          uVar8 = WindowInputExpression::GetCell<long>(this_00,(idx_t)puVar16);
          if ((long)uVar8 < 0) {
            pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string((string *)&n,"Invalid GROUPS PRECEDING value",&local_b9);
            OutOfRangeException::OutOfRangeException(pOVar13,(string *)&n);
            __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error)
            ;
          }
          piVar15 = local_98;
          if (uVar8 != 0) {
            n = uVar8;
            iVar9 = FindPrevStart((ValidityMask *)local_a8,iVar10,iVar9,&n);
            piVar15 = local_98;
          }
        }
        local_b8[(long)puVar16] = iVar9;
      }
      break;
    case EXPR_FOLLOWING_GROUPS:
      for (puVar16 = (undefined1 *)0x0; count = (idx_t)local_88, values = local_b8,
          local_88 != (optional_ptr<duckdb::WindowCursor,_true> *)puVar16; puVar16 = puVar16 + 1) {
        bVar4 = WindowInputExpression::CellIsNull(this_00,(idx_t)puVar16);
        iVar9 = piVar15[(long)puVar16];
        if (!bVar4) {
          iVar10 = local_78[(long)puVar16];
          uVar8 = WindowInputExpression::GetCell<long>(this_00,(idx_t)puVar16);
          if ((long)uVar8 < 0) {
            pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string((string *)&n,"Invalid GROUPS FOLLOWING value",&local_b9);
            OutOfRangeException::OutOfRangeException(pOVar13,(string *)&n);
            __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error)
            ;
          }
          piVar15 = local_98;
          if (uVar8 != 0) {
            n = uVar8;
            iVar9 = FindNextStart((ValidityMask *)local_a8,iVar9 + 1,iVar10,&n);
            piVar15 = local_98;
          }
        }
        local_b8[(long)puVar16] = iVar9;
      }
    }
  }
  ClampFrame(count,values,piVar14,local_78);
  return;
}

Assistant:

void WindowBoundariesState::FrameEnd(DataChunk &bounds, idx_t row_idx, const idx_t count,
                                     WindowInputExpression &boundary_end, const ValidityMask &order_mask,
                                     optional_ptr<WindowCursor> range) {
	auto partition_begin_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_BEGIN]);
	auto partition_end_data = FlatVector::GetData<idx_t>(bounds.data[PARTITION_END]);
	auto peer_end_data = FlatVector::GetData<idx_t>(bounds.data[PEER_END]);
	auto valid_begin_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_BEGIN]);
	auto valid_end_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_END]);
	auto frame_end_data = FlatVector::GetData<idx_t>(bounds.data[FRAME_END]);

	idx_t window_end = NumericLimits<idx_t>::Maximum();

	//	Reset previous range hints
	idx_t prev_partition = partition_begin_data[0];
	prev.start = valid_begin_data[0];
	prev.end = valid_end_data[0];

	if (has_preceding_range || has_following_range) {
		if (range_lo.get() != range.get()) {
			range_lo = range.get();
			range_hi = range_lo->Copy();
		}
	}

	switch (end_boundary) {
	case WindowBoundary::CURRENT_ROW_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			frame_end_data[chunk_idx] = row_idx + 1;
		}
		break;
	case WindowBoundary::CURRENT_ROW_RANGE:
	case WindowBoundary::CURRENT_ROW_GROUPS:
		// in RANGE or GROUPS mode it means that the frame starts or ends with the current row's
		// first or last peer in the ORDER BY ordering
		bounds.data[FRAME_END].Reference(bounds.data[PEER_END]);
		frame_end_data = peer_end_data;
		break;
	case WindowBoundary::UNBOUNDED_FOLLOWING:
		bounds.data[FRAME_END].Reference(bounds.data[PARTITION_END]);
		// No need to clamp
		return;
	case WindowBoundary::EXPR_PRECEDING_ROWS: {
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TrySubtractOperator::Operation(int64_t(row_idx + 1), boundary_end.GetCell<int64_t>(chunk_idx),
			                                    computed_start)) {
				window_end = partition_end_data[chunk_idx];
			} else {
				window_end = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	}
	case WindowBoundary::EXPR_FOLLOWING_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TryAddOperator::Operation(int64_t(row_idx + 1), boundary_end.GetCell<int64_t>(chunk_idx),
			                               computed_start)) {
				window_end = partition_end_data[chunk_idx];
			} else {
				window_end = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				const auto valid_start = valid_begin_data[chunk_idx];
				prev.start = valid_start;
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.end = valid_end;
					prev_partition = cur_partition;
				}
				window_end = FindOrderedRangeBound<false>(*range_lo, *range_hi, range_sense, valid_start, row_idx + 1,
				                                          end_boundary, boundary_end, chunk_idx, prev);
				prev.end = window_end;
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				const auto valid_end = valid_end_data[chunk_idx];
				prev.start = valid_begin_data[chunk_idx];
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.end = valid_end;
					prev_partition = cur_partition;
				}
				window_end = FindOrderedRangeBound<false>(*range_lo, *range_hi, range_sense, row_idx, valid_end,
				                                          end_boundary, boundary_end, chunk_idx, prev);
				prev.end = window_end;
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_GROUPS:
		// In GROUPS mode, the offset is an integer indicating that the frame starts or ends that many peer groups
		// before or after the current row's peer group, where a peer group is a group of rows that are equivalent
		// according to the window's ORDER BY clause.
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				//	Count peer groups backwards.
				const auto peer_end = peer_end_data[chunk_idx];
				const auto partition_begin = partition_begin_data[chunk_idx];
				const auto boundary = boundary_end.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS PRECEDING value");
				} else if (!boundary) {
					window_end = peer_end;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_end = FindPrevStart(order_mask, partition_begin, peer_end, n);
				}
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_GROUPS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				//	Count peer groups forward.
				const auto peer_end = peer_end_data[chunk_idx];
				const auto partition_end = partition_end_data[chunk_idx];
				const auto boundary = boundary_end.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS FOLLOWING value");
				} else if (!boundary) {
					window_end = peer_end;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_end = FindNextStart(order_mask, peer_end + 1, partition_end, n);
				}
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::UNBOUNDED_PRECEDING:
	case WindowBoundary::INVALID:
		throw InternalException("Unsupported window end boundary");
	}

	ClampFrame(count, frame_end_data, partition_begin_data, partition_end_data);
}